

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymObj::gen_code(CTcSymObj *this,int discard)

{
  int in_ESI;
  ulong in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcDataStream::write_obj_id((CTcDataStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d7147);
  }
  return;
}

Assistant:

void CTcSymObj::gen_code(int discard)
{
    /* write code to push the object ID */
    if (!discard)
    {
        /* push the object */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(obj_id_);

        /* note the push */
        G_cg->note_push();
    }
}